

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* splitStr_abi_cxx11_(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *__return_storage_ptr__,char *str,char splitter)

{
  long local_50 [3];
  long local_38;
  char *local_30;
  char *buf;
  char *prevPos;
  char *pcStack_18;
  char splitter_local;
  char *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rez;
  
  prevPos._6_1_ = 0;
  prevPos._7_1_ = splitter;
  pcStack_18 = str;
  str_local = (char *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  buf = pcStack_18;
  for (local_30 = pcStack_18; *local_30 != '\0'; local_30 = local_30 + 1) {
    if (*local_30 == prevPos._7_1_) {
      local_38 = (long)local_30 - (long)buf;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,long>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&buf,&local_38);
      buf = local_30 + 1;
    }
  }
  if (buf < local_30) {
    local_50[0] = (long)local_30 - (long)buf;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,long>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&buf,local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> splitStr(const char* str, const char splitter)
{
    vector<string> rez;
    const char* prevPos = str;
    const char* buf = str;
    for (; *buf; buf++)
    {
        if (*buf == splitter)
        {
            rez.emplace_back(prevPos, buf - prevPos);
            prevPos = buf + 1;
        }
    }
    if (buf > prevPos)
        rez.emplace_back(prevPos, buf - prevPos);
    return rez;
}